

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O3

void __thiscall raptor::TcpServer::OnConnectionArrived(TcpServer *this)

{
  Slice *in_RDX;
  ConnectionId in_RSI;
  
  OnConnectionArrived((TcpServer *)&this[-1]._magic_number,in_RSI,in_RDX);
  return;
}

Assistant:

void TcpServer::OnConnectionArrived(ConnectionId cid, const Slice* addr) {
    TcpMessageNode* msg = new TcpMessageNode;
    msg->cid = cid;
    msg->addr = *addr;
    msg->type = MessageType::kNewConnection;
    _mpscq.push(&msg->node);
    _count.FetchAdd(1, MemoryOrder::ACQ_REL);
    _cv.Signal();
}